

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::ReverseLayerParams::ReverseLayerParams
          (ReverseLayerParams *this,ReverseLayerParams *from)

{
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__ReverseLayerParams_003ff458;
  google::protobuf::RepeatedField<bool>::RepeatedField(&this->reversedim_,&from->reversedim_);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  google::protobuf::internal::InternalMetadata::MergeFrom<std::__cxx11::string>
            (&(this->super_MessageLite)._internal_metadata_,
             &(from->super_MessageLite)._internal_metadata_);
  return;
}

Assistant:

ReverseLayerParams::ReverseLayerParams(const ReverseLayerParams& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      reversedim_(from.reversedim_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.ReverseLayerParams)
}